

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

int __thiscall mpt::layout::line::convert(line *this,type_t type,void *ptr)

{
  undefined8 uVar1;
  point<float> pVar2;
  point<float> pVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = type_properties<mpt::layout::line_*>::id(true);
  iVar6 = (int)type;
  if (iVar4 < 0) {
    iVar4 = 0x100;
LAB_0013582a:
    if (type == 0) {
      if (ptr == (void *)0x0) {
        return iVar4;
      }
      *(uint8_t **)ptr = convert::fmt;
      return iVar4;
    }
  }
  else {
    if (iVar6 < 1) goto LAB_0013582a;
    iVar5 = type_properties<mpt::layout::line_*>::id(true);
    if (iVar5 == iVar6) {
      if (ptr == (void *)0x0) {
        return iVar4;
      }
      *(line **)ptr = this;
      return iVar4;
    }
  }
  if (ptr == (void *)0x0 || iVar6 != 0x100) {
    if (iVar6 != 0x100) {
      if (iVar6 == 0x84 && ptr != (void *)0x0) {
        this = (line *)&this->super_object;
        goto LAB_00135857;
      }
      if (iVar6 != 0x84) {
        if (iVar6 < 1) {
          return -3;
        }
        uVar1 = *(undefined8 *)&this->super_line;
        pVar2 = (this->super_line).from.super_point<float>;
        pVar3 = (this->super_line).to.super_point<float>;
        iVar5 = type_properties<mpt::line>::id(true);
        if (iVar5 == iVar6) {
          if (ptr == (void *)0x0) {
            return 0x84;
          }
          *(undefined8 *)ptr = uVar1;
          *(point<float> *)((long)ptr + 8) = pVar2;
          *(point<float> *)((long)ptr + 0x10) = pVar3;
          return 0x84;
        }
        iVar5 = type_properties<mpt::color_*>::id(true);
        if (iVar5 == iVar6) {
          if (ptr != (void *)0x0) {
            *(line **)ptr = &this->super_line;
          }
          iVar6 = type_properties<mpt::lineattr>::id(true);
        }
        else {
          iVar5 = type_properties<mpt::lineattr_*>::id(true);
          if (iVar5 != iVar6) {
            return -3;
          }
          if (ptr != (void *)0x0) {
            *(lineattr **)ptr = &(this->super_line).attr;
          }
          iVar6 = type_properties<mpt::color>::id(true);
        }
        goto LAB_0013586f;
      }
    }
  }
  else {
LAB_00135857:
    *(line **)ptr = this;
  }
  iVar6 = type_properties<mpt::line>::id(true);
LAB_0013586f:
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

int layout::line::convert(type_t type, void *ptr)
{
	int me = type_properties<line *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast< ::mpt::line>(*this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(&color, type, ptr)) {
		int la = type_properties<::mpt::lineattr>::id(true);
		return la > 0 ? la : me;
	}
	if (assign(&attr, type, ptr)) {
		int col = type_properties<::mpt::color>::id(true);
		return col > 0 ? col : me;
	}
	return BadType;
}